

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loggingTest2.cpp
# Opt level: O0

void __thiscall LogTest2::Test1(LogTest2 *this)

{
  char cstring [5];
  char c;
  int i;
  double d;
  LogTest2 *this_local;
  
  jh_log_print(2,"void LogTest2::Test1()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/loggingTest2.cpp"
               ,0x74,
               "This will print a warning to the logging file with  information about the file name and line number"
              );
  jh_log_print(3,"void LogTest2::Test1()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/loggingTest2.cpp"
               ,0x77,"This will do the same as above but also include the value of errno?");
  jh_log_print(0,"void LogTest2::Test1()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/loggingTest2.cpp"
               ,0x7b,"This will print an error to the logging file.");
  jh_log_print(2,"void LogTest2::Test1()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/loggingTest2.cpp"
               ,0x84,"This will print a warning to the logging file since the assert failed.");
  return;
}

Assistant:

void LogTest2::Test1()
{
	
	LOG_NOTICE( "This will print a notice to the logging file all "
				"LOG_ functions include the file and line number they "
				"came from. But they don't pretty print" );
	
	// All of the LOG_ and ASSERT_ functions work just like printf
	double d = 3.14;
	int i = -275;
	char c = 'c';
	char cstring[] = { 'a', 'b', 'c', 'f', 0x0 };
	LOG_NOTICE( "This is how you print a double(float): %f . "
				"This is how you print a int: %d. "
				"A char:%c  and a c-style string: %s (be sure it is null "
				"terminated).", d, i, c, cstring );

	LOG_WARN( "This will print a warning to the logging file with "
			  " information about the file name and line number");
	
	LOG_WARN_PERROR( "This will do the same as above but also include the "  
					 "value of errno?");
	
		
	// This is not fatal but will log a error message.
	LOG_ERR( "This will print an error to the logging file."  );
	// This is a fatal error message it will stop execution of your program.
	//LOG_ERR_FATAL( "This would do the same as above but also stop the "
	//			   "execution of the program"  );

	
	// This is not fatal; and will only log if the first argument
	// evaluates to false.
	ASSERT_WARN( false, "This will print a warning to the logging file "
				"since the assert failed." );
	// This is fatal if the first argument evaluates to false.
	ASSERT_ERR( true, "Nothing will happen here."  );

	
	
	
}